

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O3

Float __thiscall pbrt::Image::BilerpChannel(Image *this,Point2f p,int c,WrapMode2D wrapMode)

{
  undefined1 auVar1 [16];
  undefined8 unaff_RBX;
  long lVar2;
  Point2i p_00;
  Point2i p_01;
  undefined1 auVar3 [16];
  int iVar4;
  Float FVar5;
  Float FVar6;
  Float FVar7;
  undefined1 in_register_00001208 [56];
  undefined1 auVar8 [64];
  uint uVar10;
  undefined1 auVar9 [64];
  float fVar11;
  undefined1 auVar12 [16];
  float fVar13;
  undefined1 extraout_var [60];
  
  auVar8._8_56_ = in_register_00001208;
  auVar8._0_8_ = p.super_Tuple2<pbrt::Point2,_float>;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar3._8_4_ = 0xbf000000;
  auVar3._0_8_ = 0xbf000000bf000000;
  auVar3._12_4_ = 0xbf000000;
  auVar3 = vfmadd213ps_avx512vl(auVar12,auVar8._0_16_,auVar3);
  auVar12 = vroundps_avx(auVar3,9);
  iVar4 = (int)auVar12._0_4_;
  uVar10 = (uint)auVar12._4_4_;
  lVar2 = CONCAT44((int)((ulong)unaff_RBX >> 0x20),iVar4);
  FVar5 = GetChannel(this,(Point2i)(((ulong)uVar10 << 0x20) + lVar2),c,wrapMode);
  p_00.super_Tuple2<pbrt::Point2,_int>.y = uVar10;
  p_00.super_Tuple2<pbrt::Point2,_int>.x = iVar4 + 1;
  FVar6 = GetChannel(this,p_00,c,wrapMode);
  FVar7 = GetChannel(this,(Point2i)(((ulong)(uVar10 + 1) << 0x20) + lVar2),c,wrapMode);
  p_01.super_Tuple2<pbrt::Point2,_int>.y = uVar10 + 1;
  p_01.super_Tuple2<pbrt::Point2,_int>.x = iVar4 + 1;
  auVar9._0_4_ = GetChannel(this,p_01,c,wrapMode);
  auVar9._4_60_ = extraout_var;
  auVar1._4_4_ = uVar10;
  auVar1._0_4_ = iVar4;
  auVar1._8_4_ = (int)auVar12._8_4_;
  auVar1._12_4_ = (int)auVar12._12_4_;
  auVar12 = vcvtdq2ps_avx(auVar1);
  auVar3 = vsubps_avx(auVar3,auVar12);
  auVar12 = vmovshdup_avx(auVar3);
  fVar11 = auVar3._0_4_;
  fVar13 = auVar12._0_4_;
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * (1.0 - fVar13) * FVar6)),
                            ZEXT416((uint)((1.0 - fVar11) * (1.0 - fVar13))),ZEXT416((uint)FVar5));
  auVar12 = vfmadd132ss_fma(ZEXT416((uint)((1.0 - fVar11) * fVar13)),auVar12,ZEXT416((uint)FVar7));
  auVar12 = vfmadd213ss_fma(auVar9._0_16_,ZEXT416((uint)(fVar11 * fVar13)),auVar12);
  return auVar12._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float BilerpChannel(Point2f p, int c, WrapMode2D wrapMode = WrapMode::Clamp) const {
        // Compute discrete pixel coordinates and offsets for _p_
        Float x = p[0] * resolution.x - 0.5f, y = p[1] * resolution.y - 0.5f;
        int xi = std::floor(x), yi = std::floor(y);
        Float dx = x - xi, dy = y - yi;

        // Load pixel channel values and return bilinearly interpolated value
        pstd::array<Float, 4> v = {GetChannel({xi, yi}, c, wrapMode),
                                   GetChannel({xi + 1, yi}, c, wrapMode),
                                   GetChannel({xi, yi + 1}, c, wrapMode),
                                   GetChannel({xi + 1, yi + 1}, c, wrapMode)};
        return ((1 - dx) * (1 - dy) * v[0] + dx * (1 - dy) * v[1] + (1 - dx) * dy * v[2] +
                dx * dy * v[3]);
    }